

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

deUint32 __thiscall
tcu::astc::anon_unknown_0::BitAccessStream::getNext(BitAccessStream *this,int num)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  int numBits;
  
  if (num != 0) {
    iVar4 = this->m_length;
    iVar1 = this->m_ndx;
    if (iVar1 < iVar4) {
      iVar2 = num + iVar1;
      if (iVar2 <= iVar4) {
        iVar4 = iVar2;
      }
      numBits = 0;
      if (0 < iVar4 - iVar1) {
        numBits = iVar4 - iVar1;
      }
      iVar5 = iVar1 + numBits + -1;
      this->m_ndx = iVar2;
      iVar4 = this->m_startNdxInSrc;
      if (this->m_forward == true) {
        dVar3 = Block128::getBits(this->m_src,iVar1 + iVar4,iVar5 + iVar4);
        return dVar3;
      }
      dVar3 = Block128::getBits(this->m_src,iVar4 - iVar5,iVar4 - iVar1);
      dVar3 = reverseBits(dVar3,numBits);
      return dVar3;
    }
  }
  return 0;
}

Assistant:

deUint32 getNext (int num)
	{
		if (num == 0 || m_ndx >= m_length)
			return 0;

		const int end				= m_ndx + num;
		const int numBitsFromSrc	= de::max(0, de::min(m_length, end) - m_ndx);
		const int low				= m_ndx;
		const int high				= m_ndx + numBitsFromSrc - 1;

		m_ndx += num;

		return m_forward ?			   m_src.getBits(m_startNdxInSrc + low,  m_startNdxInSrc + high)
						 : reverseBits(m_src.getBits(m_startNdxInSrc - high, m_startNdxInSrc - low), numBitsFromSrc);
	}